

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Dumper::handleUnsupportedType(Dumper *this,Slice slice)

{
  UnsupportedTypeBehavior UVar1;
  Sink *pSVar2;
  char *__rhs;
  Exception *this_00;
  allocator<char> local_71;
  Slice slice_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  UVar1 = this->options->unsupportedTypeBehavior;
  slice_local = slice;
  if (UVar1 == ConvertUnsupportedType) {
    pSVar2 = this->_sink;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"\"(non-representable type ",&local_71);
    __rhs = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::typeName
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &slice_local);
    std::operator+(&local_48,&local_68,__rhs);
    std::operator+(&local_28,&local_48,")\"");
    (*pSVar2->_vptr_Sink[5])(pSVar2,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    return;
  }
  if (UVar1 == NullifyUnsupportedType) {
    (*this->_sink->_vptr_Sink[3])(this->_sink,"null",4);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,NoJsonEquivalent);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Dumper::handleUnsupportedType(Slice slice) {
  if (options->unsupportedTypeBehavior == Options::NullifyUnsupportedType) {
    _sink->append("null", 4);
    return;
  } else if (options->unsupportedTypeBehavior ==
             Options::ConvertUnsupportedType) {
    _sink->append(std::string("\"(non-representable type ") + slice.typeName() +
                  ")\"");
    return;
  }

  throw Exception(Exception::NoJsonEquivalent);
}